

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Uint64 Diligent::GetStagingTextureLocationOffset
                 (TextureDesc *TexDesc,Uint32 ArraySlice,Uint32 MipLevel,Uint32 Alignment,
                 Uint32 LocationX,Uint32 LocationY,Uint32 LocationZ)

{
  byte bVar1;
  byte bVar2;
  TextureFormatAttribs *pTVar3;
  bool bVar4;
  Uint32 UVar5;
  uint uVar6;
  Char *pCVar7;
  type tVar8;
  TextureFormatAttribs *this;
  undefined4 in_register_0000000c;
  char (*Args_1) [135];
  undefined1 local_198 [8];
  string msg_4;
  string msg_3;
  TextureFormatAttribs *FmtAttribs;
  TextureFormatAttribs **local_120;
  MipLevelProperties *MipLevelAttribs;
  string msg_2;
  MipLevelProperties MipInfo_1;
  undefined1 local_c0 [4];
  Uint32 mip_1;
  MipLevelProperties MipInfo;
  Uint64 UStack_88;
  Uint32 mip;
  Uint64 ArraySliceSize;
  Uint64 Offset;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 LocationY_local;
  Uint32 LocationX_local;
  Uint32 Alignment_local;
  Uint32 MipLevel_local;
  Uint32 ArraySlice_local;
  TextureDesc *TexDesc_local;
  
  Args_1 = (char (*) [135])CONCAT44(in_register_0000000c,Alignment);
  msg.field_2._12_4_ = LocationY;
  if ((((TexDesc->MipLevels == 0) || (UVar5 = TextureDesc::GetArraySize(TexDesc), UVar5 == 0)) ||
      (TexDesc->Width == 0)) || ((TexDesc->Height == 0 || (TexDesc->Format == TEX_FORMAT_UNKNOWN))))
  {
    FormatString<char[26],char[135]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN"
               ,Args_1);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"GetStagingTextureLocationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x93b);
    std::__cxx11::string::~string((string *)local_48);
  }
  UVar5 = TextureDesc::GetArraySize(TexDesc);
  if ((UVar5 <= ArraySlice) || (TexDesc->MipLevels <= MipLevel)) {
    UVar5 = TextureDesc::GetArraySize(TexDesc);
    if ((ArraySlice != UVar5) || (MipLevel != 0)) {
      FormatString<char[26],char[125]>
                ((string *)&Offset,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0"
                 ,(char (*) [125])(ulong)UVar5);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x93c);
      std::__cxx11::string::~string((string *)&Offset);
    }
  }
  ArraySliceSize = 0;
  if (ArraySlice != 0) {
    UStack_88 = 0;
    for (MipInfo.MipSize._4_4_ = 0; MipInfo.MipSize._4_4_ < TexDesc->MipLevels;
        MipInfo.MipSize._4_4_ = MipInfo.MipSize._4_4_ + 1) {
      GetMipLevelProperties((MipLevelProperties *)local_c0,TexDesc,MipInfo.MipSize._4_4_);
      tVar8 = AlignUp<unsigned_long,unsigned_int>(MipInfo.DepthSliceSize,Alignment);
      UStack_88 = tVar8 + UStack_88;
    }
    ArraySliceSize = UStack_88;
    bVar4 = TextureDesc::IsArray(TexDesc);
    if (bVar4) {
      ArraySliceSize = ArraySlice * UStack_88;
    }
  }
  for (MipInfo_1.MipSize._4_4_ = 0; MipInfo_1.MipSize._4_4_ < MipLevel;
      MipInfo_1.MipSize._4_4_ = MipInfo_1.MipSize._4_4_ + 1) {
    GetMipLevelProperties
              ((MipLevelProperties *)((long)&msg_2.field_2 + 8),TexDesc,MipInfo_1.MipSize._4_4_);
    tVar8 = AlignUp<unsigned_long,unsigned_int>(MipInfo_1.DepthSliceSize,Alignment);
    ArraySliceSize = tVar8 + ArraySliceSize;
  }
  UVar5 = TextureDesc::GetArraySize(TexDesc);
  if (ArraySlice == UVar5) {
    if (((LocationX != 0) || (msg.field_2._12_4_ != 0)) || (LocationZ != 0)) {
      FormatString<char[60]>
                ((string *)&MipLevelAttribs,
                 (char (*) [60])"Staging buffer size is requested: location must be (0,0,0).");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x956);
      std::__cxx11::string::~string((string *)&MipLevelAttribs);
    }
  }
  else if (((LocationX != 0) || (msg.field_2._12_4_ != 0)) || (LocationZ != 0)) {
    GetMipLevelProperties((MipLevelProperties *)&FmtAttribs,TexDesc,MipLevel);
    local_120 = &FmtAttribs;
    this = GetTextureFormatAttribs(TexDesc->Format);
    if (((*(uint *)local_120 <= LocationX) ||
        (*(uint *)((long)local_120 + 4) <= (uint)msg.field_2._12_4_)) ||
       (*(uint *)(local_120 + 2) <= LocationZ)) {
      FormatString<char[36]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [36])"Specified location is out of bounds");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x95d);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if ((this->ComponentType == COMPONENT_TYPE_COMPRESSED) &&
       ((LocationX % (uint)this->BlockWidth != 0 ||
        ((uint)msg.field_2._12_4_ % (uint)this->BlockHeight != 0)))) {
      FormatString<char[86]>
                ((string *)local_198,
                 (char (*) [86])
                 "For compressed texture formats, location must be a multiple of compressed block size."
                );
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x961);
      std::__cxx11::string::~string((string *)local_198);
    }
    uVar6 = LocationZ * *(uint *)((long)local_120 + 0xc) + msg.field_2._12_4_;
    bVar1 = this->BlockHeight;
    pTVar3 = local_120[3];
    bVar2 = this->BlockWidth;
    UVar5 = TextureFormatAttribs::GetElementSize(this);
    ArraySliceSize =
         ((ulong)LocationX / (ulong)bVar2) * (ulong)UVar5 +
         ((ulong)uVar6 / (ulong)bVar1) * (long)pTVar3 + ArraySliceSize;
  }
  return ArraySliceSize;
}

Assistant:

Uint64 GetStagingTextureLocationOffset(const TextureDesc& TexDesc,
                                       Uint32             ArraySlice,
                                       Uint32             MipLevel,
                                       Uint32             Alignment,
                                       Uint32             LocationX,
                                       Uint32             LocationY,
                                       Uint32             LocationZ)
{
    VERIFY_EXPR(TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN);
    VERIFY_EXPR(ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0);

    Uint64 Offset = 0;
    if (ArraySlice > 0)
    {
        Uint64 ArraySliceSize = 0;
        for (Uint32 mip = 0; mip < TexDesc.MipLevels; ++mip)
        {
            MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
            ArraySliceSize += AlignUp(MipInfo.MipSize, Alignment);
        }

        Offset = ArraySliceSize;
        if (TexDesc.IsArray())
            Offset *= ArraySlice;
    }

    for (Uint32 mip = 0; mip < MipLevel; ++mip)
    {
        MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
        Offset += AlignUp(MipInfo.MipSize, Alignment);
    }

    if (ArraySlice == TexDesc.GetArraySize())
    {
        VERIFY(LocationX == 0 && LocationY == 0 && LocationZ == 0,
               "Staging buffer size is requested: location must be (0,0,0).");
    }
    else if (LocationX != 0 || LocationY != 0 || LocationZ != 0)
    {
        const MipLevelProperties&   MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
        VERIFY(LocationX < MipLevelAttribs.LogicalWidth && LocationY < MipLevelAttribs.LogicalHeight && LocationZ < MipLevelAttribs.Depth,
               "Specified location is out of bounds");
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY((LocationX % FmtAttribs.BlockWidth) == 0 && (LocationY % FmtAttribs.BlockHeight) == 0,
                   "For compressed texture formats, location must be a multiple of compressed block size.");
        }

        // For compressed-block formats, RowSize is the size of one compressed row.
        // For non-compressed formats, BlockHeight is 1.
        Offset += (LocationZ * MipLevelAttribs.StorageHeight + LocationY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize;

        // For non-compressed formats, BlockWidth is 1.
        Offset += Uint64{LocationX / FmtAttribs.BlockWidth} * FmtAttribs.GetElementSize();

        // Note: this addressing complies with how Vulkan (as well as OpenGL/GLES and Metal) address
        // textures when copying data to/from buffers:
        //      address of (x,y,z) = bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
    }

    return Offset;
}